

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

iterator __thiscall
llvm::SmallVectorImpl<std::__cxx11::string>::insert<llvm::StringRef_const*,void>
          (SmallVectorImpl<std::__cxx11::string> *this,iterator I,StringRef *From,StringRef *To)

{
  long lVar1;
  StringRef *pSVar2;
  size_t sVar3;
  size_t sVar4;
  string local_130;
  StringRef *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *J;
  size_t NumOverwritten;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *OldEnd;
  move_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *OldEnd_1;
  size_t NumToInsert;
  size_t InsertElt;
  StringRef *To_local;
  StringRef *From_local;
  iterator I_local;
  SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  SmallVectorImpl<std::__cxx11::string> *local_a8;
  SmallVectorImpl<std::__cxx11::string> *local_a0;
  SmallVectorImpl<std::__cxx11::string> *local_90;
  SmallVectorImpl<std::__cxx11::string> *local_88;
  SmallVectorImpl<std::__cxx11::string> *local_80;
  SmallVectorImpl<std::__cxx11::string> *local_78;
  SmallVectorImpl<std::__cxx11::string> *local_70;
  SmallVectorImpl<std::__cxx11::string> *local_68;
  SmallVectorImpl<std::__cxx11::string> *local_60;
  SmallVectorImpl<std::__cxx11::string> *local_58;
  SmallVectorImpl<std::__cxx11::string> *local_50;
  SmallVectorImpl<std::__cxx11::string> *local_48;
  SmallVectorImpl<std::__cxx11::string> *local_40;
  SmallVectorImpl<std::__cxx11::string> *local_38;
  SmallVectorImpl<std::__cxx11::string> *local_30;
  SmallVectorImpl<std::__cxx11::string> *local_28;
  SmallVectorImpl<std::__cxx11::string> *local_20;
  SmallVectorImpl<std::__cxx11::string> *local_18;
  SmallVectorImpl<std::__cxx11::string> *local_10;
  
  NumToInsert = (long)I - *(long *)this >> 5;
  lVar1 = *(long *)this;
  InsertElt = (size_t)To;
  To_local = From;
  From_local = (StringRef *)I;
  I_local = (iterator)this;
  local_90 = this;
  local_18 = this;
  local_10 = this;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  pSVar2 = From_local;
  if (I == (iterator)(lVar1 + sVar3 * 0x20)) {
    append<llvm::StringRef_const*,void>(this,To_local,(StringRef *)InsertElt);
    this_local = (SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(*(long *)this + NumToInsert * 0x20);
  }
  else {
    local_a0 = this;
    if (From_local < *(StringRef **)this) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x259,
                    "iterator llvm::SmallVectorImpl<std::basic_string<char>>::insert(iterator, ItTy, ItTy) [T = std::basic_string<char>, ItTy = const llvm::StringRef *]"
                   );
    }
    lVar1 = *(long *)this;
    local_28 = this;
    local_20 = this;
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    if ((StringRef *)(lVar1 + sVar3 * 0x20) < pSVar2) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x25a,
                    "iterator llvm::SmallVectorImpl<std::basic_string<char>>::insert(iterator, ItTy, ItTy) [T = std::basic_string<char>, ItTy = const llvm::StringRef *]"
                   );
    }
    OldEnd_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::distance<llvm::StringRef_const*>(To_local,(StringRef *)InsertElt);
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::reserve((SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this,(size_type)(&OldEnd_1->_M_dataplus + sVar3));
    From_local = (StringRef *)(*(long *)this + NumToInsert * 0x20);
    lVar1 = *(long *)this;
    local_a8 = this;
    local_38 = this;
    local_30 = this;
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        ((long)((lVar1 + sVar3 * 0x20) - (long)From_local) >> 5) < OldEnd_1) {
      lVar1 = *(long *)this;
      local_78 = this;
      local_70 = this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      NumOverwritten = lVar1 + sVar3 * 0x20;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)(&OldEnd_1->_M_dataplus + sVar3));
      pSVar2 = From_local;
      sVar3 = NumOverwritten;
      J = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)(NumOverwritten - (long)From_local) >> 5);
      lVar1 = *(long *)this;
      local_88 = this;
      local_80 = this;
      sVar4 = SmallVectorBase::size((SmallVectorBase *)this);
      SmallVectorTemplateBase<std::__cxx11::string,false>::
      uninitialized_move<std::__cxx11::string*,std::__cxx11::string*>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (lVar1 + sVar4 * 0x20 + (long)J * -0x20));
      local_110 = From_local;
      for (; J != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          J = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&J[-1].field_2 + 0xf)) {
        StringRef::operator_cast_to_string(&local_130,To_local);
        std::__cxx11::string::operator=((string *)local_110,(string *)&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        local_110 = local_110 + 2;
        To_local = To_local + 1;
      }
      SmallVectorTemplateBase<std::__cxx11::string,false>::
      uninitialized_copy<llvm::StringRef_const*,std::__cxx11::string*>
                (To_local,(StringRef *)InsertElt,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)NumOverwritten
                );
      this_local = (SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)From_local;
    }
    else {
      lVar1 = *(long *)this;
      local_48 = this;
      local_40 = this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (lVar1 + sVar3 * 0x20);
      lVar1 = *(long *)this;
      local_58 = this;
      local_50 = this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      std::
      move_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
      ::move_iterator(&local_f0,(iterator_type)(lVar1 + sVar3 * 0x20 + (long)OldEnd_1 * -0x20));
      lVar1 = *(long *)this;
      local_68 = this;
      local_60 = this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      std::
      move_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
      ::move_iterator((move_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                       *)&OldEnd,(iterator_type)(lVar1 + sVar3 * 0x20));
      append<std::move_iterator<std::__cxx11::string*>,void>
                (this,local_f0,
                 (move_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  )OldEnd);
      std::move_backward<std::__cxx11::string*,std::__cxx11::string*>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)From_local,
                 local_e8 + -(long)OldEnd_1,local_e8);
      std::copy<llvm::StringRef_const*,std::__cxx11::string*>
                (To_local,(StringRef *)InsertElt,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)From_local);
      this_local = (SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)From_local;
    }
  }
  return (iterator)this_local;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->set_size(this->size() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }